

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O0

Code * __thiscall
md::Code::movem(Code *this,vector<md::DataRegister,_std::allocator<md::DataRegister>_> *data_regs,
               vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *addr_regs,
               bool direction_storage,AddressRegister *destination,Size size)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  reference pDVar5;
  reference pAVar6;
  uint16_t opcode;
  AddressRegister *r_3;
  const_iterator __end2_3;
  const_iterator __begin2_3;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *__range2_3;
  DataRegister *r_2;
  const_iterator __end2_2;
  const_iterator __begin2_2;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> *__range2_2;
  AddressRegister *r_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *__range2_1;
  DataRegister *r;
  const_iterator __end2;
  const_iterator __begin2;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> *__range2;
  uint16_t registersToStore;
  uint8_t dest_mxn;
  uint8_t dest_xn;
  uint8_t dest_m;
  uint8_t direction_bit;
  uint8_t size_bit;
  Size size_local;
  AddressRegister *destination_local;
  bool direction_storage_local;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> *addr_regs_local;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> *data_regs_local;
  Code *this_local;
  
  cVar1 = '\x03';
  if (direction_storage) {
    cVar1 = '\x04';
  }
  iVar3 = (**(destination->super_Register).super_Param._vptr_Param)();
  __range2._4_2_ = 0;
  if (direction_storage) {
    __end2 = std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::begin(data_regs);
    r = (DataRegister *)
        std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::end(data_regs);
    while (bVar2 = __gnu_cxx::
                   operator==<const_md::DataRegister_*,_std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>_>
                             (&__end2,(__normal_iterator<const_md::DataRegister_*,_std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>_>
                                       *)&r), ((bVar2 ^ 0xffU) & 1) != 0) {
      pDVar5 = __gnu_cxx::
               __normal_iterator<const_md::DataRegister_*,_std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>_>
               ::operator*(&__end2);
      iVar4 = (**(pDVar5->super_Register).super_Param._vptr_Param)();
      __range2._4_2_ = __range2._4_2_ | (ushort)(0x8000 >> ((byte)iVar4 & 0x1f));
      __gnu_cxx::
      __normal_iterator<const_md::DataRegister_*,_std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>_>
      ::operator++(&__end2);
    }
    __end2_1 = std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::begin
                         (addr_regs);
    r_1 = (AddressRegister *)
          std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::end(addr_regs);
    while (bVar2 = __gnu_cxx::
                   operator==<const_md::AddressRegister_*,_std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>_>
                             (&__end2_1,
                              (__normal_iterator<const_md::AddressRegister_*,_std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>_>
                               *)&r_1), ((bVar2 ^ 0xffU) & 1) != 0) {
      pAVar6 = __gnu_cxx::
               __normal_iterator<const_md::AddressRegister_*,_std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>_>
               ::operator*(&__end2_1);
      iVar4 = (**(pAVar6->super_Register).super_Param._vptr_Param)();
      __range2._4_2_ = __range2._4_2_ | (ushort)(0x80 >> ((byte)iVar4 & 0x1f));
      __gnu_cxx::
      __normal_iterator<const_md::AddressRegister_*,_std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>_>
      ::operator++(&__end2_1);
    }
  }
  else {
    __end2_2 = std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::begin(data_regs);
    r_2 = (DataRegister *)
          std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::end(data_regs);
    while (bVar2 = __gnu_cxx::
                   operator==<const_md::DataRegister_*,_std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>_>
                             (&__end2_2,
                              (__normal_iterator<const_md::DataRegister_*,_std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>_>
                               *)&r_2), ((bVar2 ^ 0xffU) & 1) != 0) {
      pDVar5 = __gnu_cxx::
               __normal_iterator<const_md::DataRegister_*,_std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>_>
               ::operator*(&__end2_2);
      iVar4 = (**(pDVar5->super_Register).super_Param._vptr_Param)();
      __range2._4_2_ = __range2._4_2_ | (ushort)(1 << ((byte)iVar4 & 0x1f));
      __gnu_cxx::
      __normal_iterator<const_md::DataRegister_*,_std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>_>
      ::operator++(&__end2_2);
    }
    __end2_3 = std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::begin
                         (addr_regs);
    r_3 = (AddressRegister *)
          std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::end(addr_regs);
    while (bVar2 = __gnu_cxx::
                   operator==<const_md::AddressRegister_*,_std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>_>
                             (&__end2_3,
                              (__normal_iterator<const_md::AddressRegister_*,_std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>_>
                               *)&r_3), ((bVar2 ^ 0xffU) & 1) != 0) {
      pAVar6 = __gnu_cxx::
               __normal_iterator<const_md::AddressRegister_*,_std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>_>
               ::operator*(&__end2_3);
      iVar4 = (**(pAVar6->super_Register).super_Param._vptr_Param)();
      __range2._4_2_ = __range2._4_2_ | (ushort)(0x100 << ((byte)iVar4 & 0x1f));
      __gnu_cxx::
      __normal_iterator<const_md::AddressRegister_*,_std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>_>
      ::operator++(&__end2_3);
    }
  }
  add_opcode(this,(ushort)!direction_storage * 0x400 + 0x4880 + (ushort)(size == LONG) * 0x40 +
                  (ushort)(byte)(cVar1 * '\b' + (char)iVar3));
  add_word(this,__range2._4_2_);
  return this;
}

Assistant:

Code& Code::movem(const std::vector<DataRegister>& data_regs, const std::vector<AddressRegister>& addr_regs, bool direction_storage, const AddressRegister& destination, md::Size size)
{
    uint8_t size_bit = (size == md::Size::LONG) ? 1 : 0;
    uint8_t direction_bit = (direction_storage) ? 0 : 1;

    uint8_t dest_m = (direction_storage) ? 0x4 : 0x3;
    uint8_t dest_xn = destination.getXn();
    uint8_t dest_mxn = (dest_m << 3) + dest_xn;

    uint16_t registersToStore = 0x0000;
    if(direction_storage)
    {
        for(const DataRegister& r : data_regs)
            registersToStore |= (0x8000 >> r.getXn());
        for(const AddressRegister& r : addr_regs)
            registersToStore |= (0x0080 >> r.getXn());
    }
    else
    {
        for (const DataRegister& r : data_regs)
            registersToStore |= (0x0001 << r.getXn());
        for (const AddressRegister& r : addr_regs)
            registersToStore |= (0x0100 << r.getXn());
    }

    uint16_t opcode = 0x4880 + (direction_bit << 10) + (size_bit << 6) + dest_mxn;

    this->add_opcode(opcode);
    this->add_word(registersToStore); // 0xFFFE = D0-D7 and A0-A6
    return *this;
}